

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O2

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t _elemsize;
  int *piVar4;
  void *__ptr;
  Allocator *pAVar5;
  ulong uVar6;
  Mat *pMVar7;
  long lVar8;
  int q;
  long lVar9;
  int iVar10;
  int z;
  int q_1;
  uint uVar11;
  int _woffset;
  int _hoffset;
  Mat *local_148;
  int _outw;
  Mat m;
  int _outh;
  Mat m_1;
  int _outc;
  int _outd;
  int _coffset;
  Option *local_88;
  int local_80;
  int _doffset;
  Mat m_2;
  
  iVar10 = bottom_blob->w;
  iVar1 = bottom_blob->h;
  local_80 = bottom_blob->d;
  iVar2 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  _outw = -1;
  _outh = -1;
  _outd = -1;
  uVar11 = bottom_blob->dims - 1;
  if (uVar11 < 4) {
    lVar9 = (long)iVar10;
    lVar8 = (long)iVar1;
    m.dims = 1;
    m.w = iVar10;
    switch(uVar11) {
    case 0:
      m.cstep = bottom_blob->elempack * lVar9;
      m.w = (int)m.cstep;
      m.h = 1;
      m.d = 1;
      m.c = m.dims;
      goto LAB_002644f4;
    case 1:
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
      lVar8 = bottom_blob->elempack * lVar8;
      m.dims = 2;
      m.h = (int)lVar8;
      m.d = 1;
      m.c = 1;
      m.cstep = lVar8 * lVar9;
      goto LAB_0026456a;
    case 2:
      iVar3 = bottom_blob->elempack;
      m.dims = 3;
      m.d = 1;
      lVar8 = lVar8 * lVar9;
      break;
    case 3:
      iVar3 = bottom_blob->elempack;
      m.dims = 4;
      lVar8 = lVar8 * lVar9 * (long)local_80;
      m.d = local_80;
    }
    m.c = iVar3 * iVar2;
    m.cstep = lVar8 + 3U & 0x3ffffffffffffffc;
    m.h = iVar1;
LAB_002644f4:
    m.elempack = 1;
    m.elemsize._0_4_ = 4;
  }
  else {
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
LAB_0026456a:
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  local_148 = bottom_blob;
  local_88 = opt;
  resolve_crop_roi(this,&m,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
  piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  iVar3 = _outd;
  pMVar7 = local_148;
  switch(uVar11) {
  case 0:
    if (_outw != iVar10) {
      Mat::create(top_blob,_outw,_elemsize,local_88->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (_elemsize == 4) {
        copy_cut_border_image<float>(local_148,top_blob,0,_woffset);
        return 0;
      }
      if (_elemsize == 2) {
        copy_cut_border_image<unsigned_short>(local_148,top_blob,0,_woffset);
        return 0;
      }
      if (_elemsize == 1) {
        copy_cut_border_image<signed_char>(local_148,top_blob,0,_woffset);
        return 0;
      }
      return 0;
    }
    if (top_blob == local_148) {
      return 0;
    }
    piVar4 = local_148->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = top_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        __ptr = top_blob->data;
        pAVar5 = top_blob->allocator;
joined_r0x002646c1:
        if (pAVar5 == (Allocator *)0x0) {
          free(__ptr);
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    break;
  case 1:
    if (iVar1 != _outh || iVar10 != _outw) {
      Mat::create(top_blob,_outw,_outh,_elemsize,local_88->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (_elemsize == 4) {
        copy_cut_border_image<float>(local_148,top_blob,_hoffset,_woffset);
        return 0;
      }
      if (_elemsize != 2) {
        if (_elemsize != 1) {
          return 0;
        }
        copy_cut_border_image<signed_char>(local_148,top_blob,_hoffset,_woffset);
        return 0;
      }
      copy_cut_border_image<unsigned_short>(local_148,top_blob,_hoffset,_woffset);
      return 0;
    }
    if (top_blob == local_148) {
      return 0;
    }
    piVar4 = local_148->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = top_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        __ptr = top_blob->data;
        pAVar5 = top_blob->allocator;
        goto joined_r0x002646c1;
      }
    }
    break;
  case 2:
    if (_outc != iVar2 || (iVar1 != _outh || iVar10 != _outw)) {
      m.w = local_148->w;
      m.h = local_148->h;
      m.d = local_148->d;
      uVar6 = local_148->elemsize;
      m.data = (void *)((long)_coffset * local_148->cstep * uVar6 + (long)local_148->data);
      m.elempack = local_148->elempack;
      m.allocator = local_148->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar6;
      m.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
      m.c = _outc;
      m.cstep = ((long)m.d * uVar6 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar6;
      m.dims = local_148->dims;
      if (iVar1 != _outh || iVar10 != _outw) {
        Mat::create(top_blob,_outw,_outh,_outc,_elemsize,local_88->blob_allocator);
        iVar10 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          local_148 = (Mat *)CONCAT44(local_148._4_4_,_hoffset);
          iVar10 = 0;
          for (lVar8 = 0; lVar8 < _outc; lVar8 = lVar8 + 1) {
            m_1.elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
            m_1.data = (void *)(m.cstep * lVar8 * m_1.elemsize + (long)m.data);
            m_1.refcount = (int *)0x0;
            m_1.elempack = m.elempack;
            m_1.allocator = m.allocator;
            m_1.w = m.w;
            m_1.h = m.h;
            m_1.c = m.d;
            m_1.d = 1;
            m_1.dims = m.dims + -1;
            m_1.cstep = (m_1.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                        m_1.elemsize;
            if (m.dims == 4) {
              m_1.cstep = (long)m.h * (long)m.w;
            }
            m_2.w = top_blob->w;
            m_2.h = top_blob->h;
            m_2.elemsize = top_blob->elemsize;
            m_2.data = (void *)(top_blob->cstep * lVar8 * m_2.elemsize + (long)top_blob->data);
            m_2.elempack = top_blob->elempack;
            m_2.allocator = top_blob->allocator;
            m_2.refcount = (int *)0x0;
            m_2.c = top_blob->d;
            m_2.d = 1;
            m_2.dims = top_blob->dims + -1;
            m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                        m_2.elemsize;
            if (top_blob->dims == 4) {
              m_2.cstep = (long)m_2.h * (long)m_2.w;
            }
            if (_elemsize == 4) {
              copy_cut_border_image<float>(&m_1,&m_2,(int)local_148,_woffset);
            }
            else if (_elemsize == 2) {
              copy_cut_border_image<unsigned_short>(&m_1,&m_2,(int)local_148,_woffset);
            }
            else if (_elemsize == 1) {
              copy_cut_border_image<signed_char>(&m_1,&m_2,(int)local_148,_woffset);
            }
          }
        }
      }
      else {
        Mat::clone(&m_1,(__fn *)&m,(void *)0x0,_outh,(void *)(long)m.w);
        if (&m_1 != top_blob) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar4 = top_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = m_1.data;
          top_blob->refcount = m_1.refcount;
          top_blob->elemsize = m_1.elemsize;
          top_blob->elempack = m_1.elempack;
          top_blob->allocator = m_1.allocator;
          top_blob->dims = m_1.dims;
          top_blob->w = m_1.w;
          top_blob->h = m_1.h;
          top_blob->d = m_1.d;
          top_blob->c = m_1.c;
          top_blob->cstep = m_1.cstep;
        }
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + -1;
          UNLOCK();
          if (*m_1.refcount == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              free(m_1.data);
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if ((top_blob->data == (void *)0x0) ||
           (iVar10 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
          iVar10 = -100;
        }
      }
      piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar4 == (int *)0x0) {
        return iVar10;
      }
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 != 0) {
        return iVar10;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar10;
      }
LAB_0026511a:
      free(m.data);
      return iVar10;
    }
    if (top_blob == local_148) {
      return 0;
    }
    piVar4 = local_148->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = top_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        __ptr = top_blob->data;
        pAVar5 = top_blob->allocator;
        goto joined_r0x002646c1;
      }
    }
    break;
  case 3:
    if (_outc != iVar2 || (local_80 != _outd || (iVar1 != _outh || iVar10 != _outw))) {
      m.w = local_148->w;
      m.h = local_148->h;
      m.d = local_148->d;
      uVar6 = local_148->elemsize;
      m.data = (void *)((long)_coffset * local_148->cstep * uVar6 + (long)local_148->data);
      m.elempack = local_148->elempack;
      m.allocator = local_148->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar6;
      m.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
      m.c = _outc;
      m.cstep = ((long)m.d * uVar6 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar6;
      m.dims = local_148->dims;
      if (local_80 != _outd || (iVar1 != _outh || iVar10 != _outw)) {
        Mat::create(top_blob,_outw,_outh,_outd,_outc,_elemsize,local_88->blob_allocator);
        iVar10 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          local_148 = (Mat *)(long)_outc;
          for (lVar8 = 0; lVar8 < (long)local_148; lVar8 = lVar8 + 1) {
            for (lVar9 = 0; lVar9 < iVar3; lVar9 = lVar9 + 1) {
              m_1.elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
              m_1.cstep = (long)m.h * (long)m.w;
              m_1.data = (void *)((long)m.data +
                                 (long)(_doffset + (int)lVar9) * m_1.elemsize * m_1.cstep +
                                 m.cstep * lVar8 * m_1.elemsize);
              m_1.refcount = (int *)0x0;
              m_1.elempack = m.elempack;
              m_1.allocator = m.allocator;
              m_1.dims = 2;
              m_1.w = m.w;
              m_1.h = m.h;
              m_1.d = 1;
              m_1.c = 1;
              m_2.w = top_blob->w;
              m_2.h = top_blob->h;
              m_2.elemsize = top_blob->elemsize;
              m_2.elempack = top_blob->elempack;
              m_2.allocator = top_blob->allocator;
              m_2.cstep = (long)m_2.h * (long)m_2.w;
              m_2.data = (void *)((long)top_blob->data +
                                 lVar9 * m_2.elemsize * m_2.cstep +
                                 top_blob->cstep * lVar8 * m_2.elemsize);
              m_2.refcount = (int *)0x0;
              m_2.d = 1;
              m_2.c = 1;
              m_2.dims = m_1.dims;
              if (_elemsize == 4) {
                copy_cut_border_image<float>(&m_1,&m_2,_hoffset,_woffset);
              }
              else if (_elemsize == 2) {
                copy_cut_border_image<unsigned_short>(&m_1,&m_2,_hoffset,_woffset);
              }
              else if (_elemsize == 1) {
                copy_cut_border_image<signed_char>(&m_1,&m_2,_hoffset,_woffset);
              }
            }
          }
          iVar10 = 0;
        }
      }
      else {
        Mat::clone(&m_1,(__fn *)&m,(void *)0x0,_outh,(void *)(long)m.w);
        if (&m_1 != top_blob) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar4 = top_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = m_1.data;
          top_blob->refcount = m_1.refcount;
          top_blob->elemsize = m_1.elemsize;
          top_blob->elempack = m_1.elempack;
          top_blob->allocator = m_1.allocator;
          top_blob->dims = m_1.dims;
          top_blob->w = m_1.w;
          top_blob->h = m_1.h;
          top_blob->d = m_1.d;
          top_blob->c = m_1.c;
          top_blob->cstep = m_1.cstep;
        }
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + -1;
          UNLOCK();
          if (*m_1.refcount == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              free(m_1.data);
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if ((top_blob->data == (void *)0x0) ||
           (iVar10 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
          iVar10 = -100;
        }
      }
      piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar4 == (int *)0x0) {
        return iVar10;
      }
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 != 0) {
        return iVar10;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar10;
      }
      goto LAB_0026511a;
    }
    if (top_blob == local_148) {
      return 0;
    }
    piVar4 = local_148->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = top_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        __ptr = top_blob->data;
        pAVar5 = top_blob->allocator;
        goto joined_r0x002646c1;
      }
    }
    break;
  default:
    goto LAB_00264f50;
  }
  top_blob->cstep = 0;
  top_blob->data = (void *)0x0;
  top_blob->refcount = (int *)0x0;
  *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
  *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
  top_blob->c = 0;
  top_blob->dims = 0;
  top_blob->w = 0;
  top_blob->h = 0;
  top_blob->d = 0;
  piVar4 = pMVar7->refcount;
  top_blob->data = pMVar7->data;
  top_blob->refcount = piVar4;
  top_blob->elemsize = pMVar7->elemsize;
  top_blob->elempack = pMVar7->elempack;
  top_blob->allocator = pMVar7->allocator;
  iVar10 = pMVar7->w;
  iVar1 = pMVar7->h;
  iVar2 = pMVar7->d;
  top_blob->dims = pMVar7->dims;
  top_blob->w = iVar10;
  top_blob->h = iVar1;
  top_blob->d = iVar2;
  top_blob->c = pMVar7->c;
  top_blob->cstep = pMVar7->cstep;
LAB_00264f50:
  return 0;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset, _hoffset, _doffset, _coffset;
    int _outw = -1, _outh = -1, _outd = -1, _outc;
    resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }

        return 0;
    }

    return 0;
}